

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O1

int __thiscall
QWidgetLineControl::copy(QWidgetLineControl *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QString *pQVar1;
  long in_FS_OFFSET;
  QArrayData *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  if (*(int *)(this + 0x110) < *(int *)(this + 0x114) && *(long *)(this + 0x28) != 0) {
    QString::mid((longlong)&local_38,(longlong)(this + 0x18));
  }
  else {
    local_38 = (QArrayData *)0x0;
    puStack_30 = (undefined1 *)0x0;
    local_28 = (undefined1 *)0x0;
  }
  if ((local_28 != (undefined1 *)0x0) && (((byte)this[0x50] & 0x30) == 0)) {
    pQVar1 = (QString *)QGuiApplication::clipboard();
    QClipboard::setText(pQVar1,(Mode)&local_38);
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::copy(QClipboard::Mode mode) const
{
    QString t = selectedText();
    if (!t.isEmpty() && m_echoMode == QLineEdit::Normal) {
        QGuiApplication::clipboard()->setText(t, mode);
    }
}